

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::UpdateWitnessStackRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::UpdateWitnessStackRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *elements_function)

{
  ErrorResponse local_888;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_7d0 [4];
  JsonClassBase<cfd::js::api::json::RawTransactionResponse> local_7b0 [4];
  undefined1 local_790 [8];
  RawTransactionResponse res_2;
  RawTransactionResponseStruct local_730;
  RawTransactionResponseStruct local_668;
  undefined1 local_5a0 [8];
  RawTransactionResponseStruct response;
  UpdateWitnessStackRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_198 [8];
  UpdateWitnessStackRequest req;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
  *elements_function_local;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req.txin_.witness_stack_._168_8_ = elements_function;
  UpdateWitnessStackRequest::UpdateWitnessStackRequest((UpdateWitnessStackRequest *)local_198);
  core::JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest> *)local_198,
             request_message);
  UpdateWitnessStackRequest::ConvertToStruct
            ((UpdateWitnessStackRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (UpdateWitnessStackRequest *)local_198);
  RawTransactionResponseStruct::RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_5a0);
  if ((request._24_1_ & 1) == 0) {
    std::
    function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
    ::operator()(&local_730,bitcoin_function,
                 (UpdateWitnessStackRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    RawTransactionResponseStruct::operator=((RawTransactionResponseStruct *)local_5a0,&local_730);
    RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_730);
  }
  else {
    std::
    function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
    ::operator()(&local_668,elements_function,
                 (UpdateWitnessStackRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    RawTransactionResponseStruct::operator=((RawTransactionResponseStruct *)local_5a0,&local_668);
    RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_668);
  }
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_790);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_790,(RawTransactionResponseStruct *)local_5a0);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_(local_7b0)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_7b0);
    std::__cxx11::string::~string((string *)local_7b0);
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_790);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_888,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_7d0);
    std::__cxx11::string::operator=((string *)this,(string *)local_7d0);
    std::__cxx11::string::~string((string *)local_7d0);
    ErrorResponse::~ErrorResponse(&local_888);
  }
  res_2._87_1_ = 1;
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_5a0);
  UpdateWitnessStackRequestStruct::~UpdateWitnessStackRequestStruct
            ((UpdateWitnessStackRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  UpdateWitnessStackRequest::~UpdateWitnessStackRequest((UpdateWitnessStackRequest *)local_198);
  return this;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}